

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

void __thiscall SslTcpSocketImpl::ConEstablished(SslTcpSocketImpl *this,TcpSocketImpl *param_1)

{
  int iVar1;
  pointer pSVar2;
  type this_00;
  SSL *__val;
  wchar_t *pOut;
  type szBuffer;
  __int_type local_120;
  size_t len;
  __array temp;
  size_t nOutDataSize;
  unique_lock<std::mutex> lock;
  undefined1 local_f0 [7];
  bool bNewData;
  wstring local_c0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_80;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_40;
  uint local_1c;
  TcpSocketImpl *pTStack_18;
  int iError;
  TcpSocketImpl *param_1_local;
  SslTcpSocketImpl *this_local;
  
  pTStack_18 = param_1;
  param_1_local = &this->super_TcpSocketImpl;
  pSVar2 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  OpenSSLWrapper::SslConnection::SSLSetConnectState(pSVar2);
  pSVar2 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  iVar1 = OpenSSLWrapper::SslConnection::SSLDoHandshake(pSVar2);
  this->m_iSslInit = iVar1;
  if (this->m_iSslInit < 1) {
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    local_1c = OpenSSLWrapper::SslConnection::SSLGetError(pSVar2,this->m_iSslInit);
    if (local_1c != 2) {
      (this->super_TcpSocketImpl).super_BaseSocketImpl.m_iError = local_1c | 0x80000000;
      (this->super_TcpSocketImpl).super_BaseSocketImpl.m_iErrLoc = 0xf;
      std::__cxx11::to_wstring(&local_c0,local_1c);
      std::operator+(&local_a0,L"SSL_error after SSL_Handshake: ",&local_c0);
      std::operator+(&local_80,&local_a0,L" on ssl context: ");
      this_00 = std::
                unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                ::operator*(&this->m_pSslCon);
      __val = OpenSSLWrapper::SslConnection::operator()(this_00);
      std::__cxx11::to_wstring((wstring *)local_f0,(unsigned_long)__val);
      std::operator+(&local_60,&local_80,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_f0);
      std::operator+(&local_40,&local_60,L"\r\n");
      pOut = (wchar_t *)std::__cxx11::wstring::c_str();
      OutputDebugString(pOut);
      std::__cxx11::wstring::~wstring((wstring *)&local_40);
      std::__cxx11::wstring::~wstring((wstring *)&local_60);
      std::__cxx11::wstring::~wstring((wstring *)local_f0);
      std::__cxx11::wstring::~wstring((wstring *)&local_80);
      std::__cxx11::wstring::~wstring((wstring *)&local_a0);
      std::__cxx11::wstring::~wstring((wstring *)&local_c0);
      (*(this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[2])();
      return;
    }
    local_1c = 2;
  }
  lock._15_1_ = 0;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&nOutDataSize,&this->m_mxEnDecode);
  pSVar2 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar2);
  while ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
    std::make_unique<unsigned_char[]>((size_t)&len);
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    szBuffer = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len
                          ,0);
    local_120 = OpenSSLWrapper::SslConnection::SslGetOutData
                          (pSVar2,szBuffer,
                           (size_t)temp._M_t.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    if (local_120 != 0) {
      std::mutex::lock(&(this->super_TcpSocketImpl).m_mxOutDeque);
      std::__atomic_base<unsigned_long>::operator+=
                (&(this->super_TcpSocketImpl).m_atOutBytes.super___atomic_base<unsigned_long>,
                 local_120);
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
      ::
      emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                  *)&(this->super_TcpSocketImpl).m_quOutData,
                 (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len,
                 &local_120);
      std::mutex::unlock(&(this->super_TcpSocketImpl).m_mxOutDeque);
      lock._15_1_ = 1;
    }
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar2);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len);
  }
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&nOutDataSize);
  if ((lock._15_1_ & 1) == 1) {
    TcpSocketImpl::TriggerWriteThread(&this->super_TcpSocketImpl);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&nOutDataSize);
  return;
}

Assistant:

void SslTcpSocketImpl::ConEstablished(const TcpSocketImpl* const /*pTcpSocket*/)
{
    m_pSslCon->SSLSetConnectState();

    m_iSslInit = m_pSslCon->SSLDoHandshake();
    if (m_iSslInit <= 0)
    {
        const int iError = m_pSslCon->SSLGetError(m_iSslInit);
        if (iError != SSL_ERROR_WANT_READ)
        {
            m_iError = 0x80000000 | iError;
            m_iErrLoc = 15;
            OutputDebugString(wstring(L"SSL_error after SSL_Handshake: " + to_wstring(iError) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
            Close();
            return;
        }
    }

    bool bNewData = false;
    unique_lock<mutex> lock(m_mxEnDecode);
    size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
    while (nOutDataSize > 0)
    {
        auto temp = make_unique<uint8_t[]>(nOutDataSize);
        size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
        // Schreibt Daten in die SOCKET
        if (len > 0)
        {
            m_mxOutDeque.lock();
            m_atOutBytes += len;
            m_quOutData.emplace_back(move(temp), len);
            m_mxOutDeque.unlock();
            bNewData = true;
        }
        nOutDataSize = m_pSslCon->SslGetOutDataSize();
    }
    lock.unlock();

    if (bNewData == true)
        TriggerWriteThread();
}